

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O0

void __thiscall
hanabi_learning_env::HanabiGame::HanabiGame
          (HanabiGame *this,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *params)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  AgentObservationType AVar4;
  result_type_conflict rVar5;
  HanabiGame *in_RDI;
  int uid_1;
  int uid;
  int rank;
  value_type *in_stack_ffffffffffffe988;
  HanabiGame *in_stack_ffffffffffffe990;
  result_type in_stack_ffffffffffffe998;
  int in_stack_ffffffffffffe9a0;
  int in_stack_ffffffffffffe9a4;
  HanabiGame *in_stack_ffffffffffffe9a8;
  HanabiMove in_stack_ffffffffffffe9b0;
  int uid_00;
  undefined4 in_stack_ffffffffffffe9b8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  int local_1524;
  int local_1518;
  int local_1514;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [39];
  allocator local_41;
  string local_40 [64];
  
  std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>::
  vector((vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
          *)0x13f9b7);
  std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>::
  vector((vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
          *)0x13f9d0);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x13f9e9);
  in_RDI->num_colors_ = -1;
  in_RDI->num_ranks_ = -1;
  in_RDI->num_players_ = -1;
  in_RDI->hand_size_ = -1;
  in_RDI->max_information_tokens_ = -1;
  in_RDI->max_life_tokens_ = -1;
  in_RDI->cards_per_color_ = -1;
  in_RDI->seed_ = -1;
  in_RDI->random_start_player_ = false;
  in_RDI->observation_type_ = kCardKnowledge;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x13fa4c);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_ffffffffffffe990,
              (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_ffffffffffffe988);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"players",&local_41);
  iVar2 = ParameterValue<int>((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffe9a8,
                              (string *)
                              CONCAT44(in_stack_ffffffffffffe9a4,in_stack_ffffffffffffe9a0),
                              (int)(in_stack_ffffffffffffe998 >> 0x20));
  in_RDI->num_players_ = iVar2;
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  iVar2 = in_RDI->num_players_;
  iVar3 = MinPlayers(in_RDI);
  bVar1 = false;
  if (iVar3 <= iVar2) {
    iVar2 = in_RDI->num_players_;
    iVar3 = MaxPlayers(in_RDI);
    bVar1 = iVar2 <= iVar3;
  }
  if (!bVar1) {
    __assert_fail("num_players_ >= MinPlayers() && num_players_ <= MaxPlayers()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_game.cc"
                  ,0x21,
                  "hanabi_learning_env::HanabiGame::HanabiGame(const std::unordered_map<std::string, std::string> &)"
                 );
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"colors",&local_69);
  iVar2 = ParameterValue<int>((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffe9a8,
                              (string *)
                              CONCAT44(in_stack_ffffffffffffe9a4,in_stack_ffffffffffffe9a0),
                              (int)(in_stack_ffffffffffffe998 >> 0x20));
  in_RDI->num_colors_ = iVar2;
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  bVar1 = false;
  if (0 < in_RDI->num_colors_) {
    bVar1 = in_RDI->num_colors_ < 6;
  }
  if (!bVar1) {
    __assert_fail("num_colors_ > 0 && num_colors_ <= kMaxNumColors",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_game.cc"
                  ,0x23,
                  "hanabi_learning_env::HanabiGame::HanabiGame(const std::unordered_map<std::string, std::string> &)"
                 );
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"ranks",&local_91);
  iVar2 = ParameterValue<int>((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffe9a8,
                              (string *)
                              CONCAT44(in_stack_ffffffffffffe9a4,in_stack_ffffffffffffe9a0),
                              (int)(in_stack_ffffffffffffe998 >> 0x20));
  in_RDI->num_ranks_ = iVar2;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  bVar1 = false;
  if (0 < in_RDI->num_ranks_) {
    bVar1 = in_RDI->num_ranks_ < 6;
  }
  if (!bVar1) {
    __assert_fail("num_ranks_ > 0 && num_ranks_ <= kMaxNumRanks",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_game.cc"
                  ,0x25,
                  "hanabi_learning_env::HanabiGame::HanabiGame(const std::unordered_map<std::string, std::string> &)"
                 );
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"hand_size",&local_b9);
  HandSizeFromRules(in_RDI);
  iVar2 = ParameterValue<int>((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffe9a8,
                              (string *)
                              CONCAT44(in_stack_ffffffffffffe9a4,in_stack_ffffffffffffe9a0),
                              (int)(in_stack_ffffffffffffe998 >> 0x20));
  in_RDI->hand_size_ = iVar2;
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"max_information_tokens",&local_e1);
  iVar2 = ParameterValue<int>((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffe9a8,
                              (string *)
                              CONCAT44(in_stack_ffffffffffffe9a4,in_stack_ffffffffffffe9a0),
                              (int)(in_stack_ffffffffffffe998 >> 0x20));
  in_RDI->max_information_tokens_ = iVar2;
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"max_life_tokens",&local_109);
  iVar2 = ParameterValue<int>((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffe9a8,
                              (string *)
                              CONCAT44(in_stack_ffffffffffffe9a4,in_stack_ffffffffffffe9a0),
                              (int)(in_stack_ffffffffffffe998 >> 0x20));
  in_RDI->max_life_tokens_ = iVar2;
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"seed",&local_131);
  iVar2 = ParameterValue<int>((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffe9a8,
                              (string *)
                              CONCAT44(in_stack_ffffffffffffe9a4,in_stack_ffffffffffffe9a0),
                              (int)(in_stack_ffffffffffffe998 >> 0x20));
  in_RDI->seed_ = iVar2;
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"random_start_player",&local_159);
  bVar1 = ParameterValue<bool>
                    ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_ffffffffffffe9a8,
                     (string *)CONCAT44(in_stack_ffffffffffffe9a4,in_stack_ffffffffffffe9a0),
                     SUB81(in_stack_ffffffffffffe998 >> 0x38,0));
  in_RDI->random_start_player_ = bVar1;
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  this_00 = &in_RDI->params_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"observation_type",&local_181);
  AVar4 = ParameterValue<int>((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffe9a8,
                              (string *)
                              CONCAT44(in_stack_ffffffffffffe9a4,in_stack_ffffffffffffe9a0),
                              (int)(in_stack_ffffffffffffe998 >> 0x20));
  in_RDI->observation_type_ = AVar4;
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  while (in_RDI->seed_ == -1) {
    std::random_device::random_device((random_device *)this_00);
    rVar5 = std::random_device::operator()((random_device *)0x140221);
    in_RDI->seed_ = rVar5;
    std::random_device::~random_device((random_device *)0x140246);
  }
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)CONCAT44(in_stack_ffffffffffffe9a4,in_stack_ffffffffffffe9a0),in_stack_ffffffffffffe998)
  ;
  in_RDI->cards_per_color_ = 0;
  for (local_1514 = 0; local_1514 < in_RDI->num_ranks_; local_1514 = local_1514 + 1) {
    iVar2 = NumberCardInstances(in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9a4,
                                in_stack_ffffffffffffe9a0);
    in_RDI->cards_per_color_ = iVar2 + in_RDI->cards_per_color_;
  }
  if (in_RDI->hand_size_ * in_RDI->num_players_ <= in_RDI->cards_per_color_ * in_RDI->num_colors_) {
    local_1518 = 0;
    while( true ) {
      uid_00 = in_stack_ffffffffffffe9b0._4_4_;
      iVar2 = local_1518;
      iVar3 = MaxMoves((HanabiGame *)CONCAT44(in_stack_ffffffffffffe9a4,in_stack_ffffffffffffe9a0));
      if (iVar3 <= iVar2) break;
      in_stack_ffffffffffffe9a8 = in_RDI;
      in_stack_ffffffffffffe9b0 =
           ConstructMove((HanabiGame *)CONCAT44(iVar2,in_stack_ffffffffffffe9b8),uid_00);
      std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
      ::push_back(&in_stack_ffffffffffffe990->moves_,in_stack_ffffffffffffe988);
      local_1518 = local_1518 + 1;
    }
    local_1524 = 0;
    while( true ) {
      iVar2 = local_1524;
      iVar3 = MaxChanceOutcomes(in_stack_ffffffffffffe990);
      if (iVar3 <= iVar2) break;
      in_stack_ffffffffffffe990 = (HanabiGame *)&in_RDI->chance_outcomes_;
      ConstructChanceOutcome(in_stack_ffffffffffffe9a8,iVar3);
      std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
      ::push_back(&in_stack_ffffffffffffe990->moves_,in_stack_ffffffffffffe988);
      local_1524 = local_1524 + 1;
    }
    return;
  }
  __assert_fail("hand_size_ * num_players_ <= cards_per_color_ * num_colors_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_game.cc"
                ,0x3a,
                "hanabi_learning_env::HanabiGame::HanabiGame(const std::unordered_map<std::string, std::string> &)"
               );
}

Assistant:

HanabiGame::HanabiGame(
    const std::unordered_map<std::string, std::string>& params) {
  params_ = params;
  num_players_ = ParameterValue<int>(params_, "players", kDefaultPlayers);
  REQUIRE(num_players_ >= MinPlayers() && num_players_ <= MaxPlayers());
  num_colors_ = ParameterValue<int>(params_, "colors", kMaxNumColors);
  REQUIRE(num_colors_ > 0 && num_colors_ <= kMaxNumColors);
  num_ranks_ = ParameterValue<int>(params_, "ranks", kMaxNumRanks);
  REQUIRE(num_ranks_ > 0 && num_ranks_ <= kMaxNumRanks);
  hand_size_ = ParameterValue<int>(params_, "hand_size", HandSizeFromRules());
  max_information_tokens_ = ParameterValue<int>(
      params_, "max_information_tokens", kInformationTokens);
  max_life_tokens_ =
      ParameterValue<int>(params_, "max_life_tokens", kLifeTokens);
  seed_ = ParameterValue<int>(params_, "seed", -1);
  random_start_player_ =
      ParameterValue<bool>(params_, "random_start_player", kDefaultRandomStart);
  observation_type_ = AgentObservationType(ParameterValue<int>(
      params_, "observation_type", AgentObservationType::kCardKnowledge));
  while (seed_ == -1) {
    seed_ = std::random_device()();
  }
  rng_.seed(seed_);

  // Work out number of cards per color, and check deck size is large enough.
  cards_per_color_ = 0;
  for (int rank = 0; rank < num_ranks_; ++rank) {
    cards_per_color_ += NumberCardInstances(0, rank);
  }
  REQUIRE(hand_size_ * num_players_ <= cards_per_color_ * num_colors_);

  // Build static list of moves.
  for (int uid = 0; uid < MaxMoves(); ++uid) {
    moves_.push_back(ConstructMove(uid));
  }
  for (int uid = 0; uid < MaxChanceOutcomes(); ++uid) {
    chance_outcomes_.push_back(ConstructChanceOutcome(uid));
  }
}